

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppLongText(bool *p_open)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *text;
  char *text_end;
  uint local_70;
  int i_2;
  uint local_64;
  undefined1 local_60 [4];
  int i_1;
  ImGuiListClipper clipper;
  ImVec2 local_40;
  int local_38;
  int i;
  ImVec2 local_2c [2];
  ImVec2 local_18;
  bool *local_10;
  bool *p_open_local;
  
  local_10 = p_open;
  ImVec2::ImVec2(&local_18,520.0,600.0);
  ImGui::SetNextWindowSize(&local_18,4);
  bVar1 = ImGui::Begin("Example: Long text display",local_10,0);
  if (bVar1) {
    if ((ShowExampleAppLongText(bool*)::log == '\0') &&
       (iVar2 = __cxa_guard_acquire(&ShowExampleAppLongText(bool*)::log), iVar2 != 0)) {
      ImGuiTextBuffer::ImGuiTextBuffer(&ShowExampleAppLongText::log);
      __cxa_atexit(ImGuiTextBuffer::~ImGuiTextBuffer,&ShowExampleAppLongText::log,&__dso_handle);
      __cxa_guard_release(&ShowExampleAppLongText(bool*)::log);
    }
    ImGui::Text("Printing unusually long amount of text.");
    ImGui::Combo("Test type",&ShowExampleAppLongText::test_type,"Single call to TextUnformatted()",
                 -1);
    iVar2 = ShowExampleAppLongText::lines;
    uVar3 = ImGuiTextBuffer::size(&ShowExampleAppLongText::log);
    ImGui::Text("Buffer contents: %d lines, %d bytes",(ulong)(uint)iVar2,(ulong)uVar3);
    ImVec2::ImVec2(local_2c,0.0,0.0);
    bVar1 = ImGui::Button("Clear",local_2c);
    if (bVar1) {
      ImGuiTextBuffer::clear(&ShowExampleAppLongText::log);
      ShowExampleAppLongText::lines = 0;
    }
    ImGui::SameLine(0.0,-1.0);
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffcc,0.0,0.0);
    bVar1 = ImGui::Button("Add 1000 lines",(ImVec2 *)&stack0xffffffffffffffcc);
    if (bVar1) {
      for (local_38 = 0; local_38 < 1000; local_38 = local_38 + 1) {
        ImGuiTextBuffer::appendf
                  (&ShowExampleAppLongText::log,"%i The quick brown fox jumps over the lazy dog\n",
                   (ulong)(uint)(ShowExampleAppLongText::lines + local_38));
      }
      ShowExampleAppLongText::lines = ShowExampleAppLongText::lines + 1000;
    }
    ImVec2::ImVec2(&local_40,0.0,0.0);
    ImGui::BeginChild("Log",&local_40,false,0);
    if (ShowExampleAppLongText::test_type == 0) {
      text = ImGuiTextBuffer::begin(&ShowExampleAppLongText::log);
      text_end = ImGuiTextBuffer::end(&ShowExampleAppLongText::log);
      ImGui::TextUnformatted(text,text_end);
    }
    else if (ShowExampleAppLongText::test_type == 1) {
      ImVec2::ImVec2((ImVec2 *)&clipper.DisplayStart,0.0,0.0);
      ImGui::PushStyleVar(0xd,(ImVec2 *)&clipper.DisplayStart);
      ImGuiListClipper::ImGuiListClipper
                ((ImGuiListClipper *)local_60,ShowExampleAppLongText::lines,-1.0);
      while (bVar1 = ImGuiListClipper::Step((ImGuiListClipper *)local_60), bVar1) {
        for (local_64 = clipper.ItemsCount; (int)local_64 < clipper.StepNo; local_64 = local_64 + 1)
        {
          ImGui::Text("%i The quick brown fox jumps over the lazy dog",(ulong)local_64);
        }
      }
      ImGui::PopStyleVar(1);
      ImGuiListClipper::~ImGuiListClipper((ImGuiListClipper *)local_60);
    }
    else if (ShowExampleAppLongText::test_type == 2) {
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff94,0.0,0.0);
      ImGui::PushStyleVar(0xd,(ImVec2 *)&stack0xffffffffffffff94);
      for (local_70 = 0; (int)local_70 < ShowExampleAppLongText::lines; local_70 = local_70 + 1) {
        ImGui::Text("%i The quick brown fox jumps over the lazy dog",(ulong)local_70);
      }
      ImGui::PopStyleVar(1);
    }
    ImGui::EndChild();
    ImGui::End();
  }
  else {
    ImGui::End();
  }
  return;
}

Assistant:

static void ShowExampleAppLongText(bool* p_open)
{
    ImGui::SetNextWindowSize(ImVec2(520,600), ImGuiCond_FirstUseEver);
    if (!ImGui::Begin("Example: Long text display", p_open))
    {
        ImGui::End();
        return;
    }

    static int test_type = 0;
    static ImGuiTextBuffer log;
    static int lines = 0;
    ImGui::Text("Printing unusually long amount of text.");
    ImGui::Combo("Test type", &test_type, "Single call to TextUnformatted()\0Multiple calls to Text(), clipped manually\0Multiple calls to Text(), not clipped (slow)\0");
    ImGui::Text("Buffer contents: %d lines, %d bytes", lines, log.size());
    if (ImGui::Button("Clear")) { log.clear(); lines = 0; }
    ImGui::SameLine();
    if (ImGui::Button("Add 1000 lines"))
    {
        for (int i = 0; i < 1000; i++)
            log.appendf("%i The quick brown fox jumps over the lazy dog\n", lines+i);
        lines += 1000;
    }
    ImGui::BeginChild("Log");
    switch (test_type)
    {
    case 0:
        // Single call to TextUnformatted() with a big buffer
        ImGui::TextUnformatted(log.begin(), log.end());
        break;
    case 1:
        {
            // Multiple calls to Text(), manually coarsely clipped - demonstrate how to use the ImGuiListClipper helper.
            ImGui::PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(0,0));
            ImGuiListClipper clipper(lines);
            while (clipper.Step())
                for (int i = clipper.DisplayStart; i < clipper.DisplayEnd; i++)
                    ImGui::Text("%i The quick brown fox jumps over the lazy dog", i);
            ImGui::PopStyleVar();
            break;
        }
    case 2:
        // Multiple calls to Text(), not clipped (slow)
        ImGui::PushStyleVar(ImGuiStyleVar_ItemSpacing, ImVec2(0,0));
        for (int i = 0; i < lines; i++)
            ImGui::Text("%i The quick brown fox jumps over the lazy dog", i);
        ImGui::PopStyleVar();
        break;
    }
    ImGui::EndChild();
    ImGui::End();
}